

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICharReader.h
# Opt level: O2

void __thiscall ICharReader::ICharReader(ICharReader *this,ifstream *ifs,ostream *os,int deep)

{
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110b60;
  std::__cxx11::string::assign((char *)&(this->super_IAbstractReader).m_dataType);
  return;
}

Assistant:

explicit ICharReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep) {
        m_dataType = "Char";
    }